

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::compute_persistent_cohomology
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Filtration_value min_interval_length)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *this_00;
  Simplex_handle sh;
  pointer puVar3;
  ulong uVar4;
  iterator iVar5;
  Simplex_key SVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  logic_error *this_01;
  Simplex_handle SVar9;
  pointer puVar10;
  Simplex_key *pSVar11;
  _Hash_node_base *p_Var12;
  int iVar13;
  ulong uVar14;
  pointer puVar15;
  Simplex_key idx_fil;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertices;
  Simplex_key key;
  unsigned_long local_80;
  unsigned_long local_78;
  unsigned_long local_70;
  Simplex_key *local_68;
  iterator iStack_60;
  unsigned_long *local_58;
  int local_4c;
  Simplex_key local_48;
  _Base_ptr p_Stack_40;
  _Base_ptr local_38;
  
  if (0 < this->dim_max_) {
    (this->interval_length_policy).min_length_ = min_interval_length;
    local_70 = 0xffffffffffffffff;
    local_68 = (Simplex_key *)0x0;
    iStack_60._M_current = (Simplex_key *)0x0;
    local_58 = (unsigned_long *)0x0;
    this_00 = this->cpx_;
    puVar15 = (this_00->sorted_cells).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar10 = (this_00->sorted_cells).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (puVar15 == puVar10) {
      cubical_complex::
      Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
      initialize_filtration(this_00);
      puVar15 = (this_00->sorted_cells).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar10 = (this_00->sorted_cells).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    if (puVar15 != puVar10) {
      do {
        sh = *puVar15;
        local_70 = local_70 + 1;
        cubical_complex::
        Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
        assign_key(this->cpx_,sh,local_70);
        SVar6 = cubical_complex::
                Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                ::key(this->cpx_,sh);
        (this->dsets_).parent[SVar6] = SVar6;
        (this->dsets_).rank[SVar6] = 0;
        if (sh == 0xffffffffffffffff) {
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_01,"Only real cells have a dimension");
          __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        puVar3 = (this->cpx_->super_Bitmap_cubical_complex_base<double>).multipliers.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = (long)(this->cpx_->super_Bitmap_cubical_complex_base<double>).multipliers.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
        iVar13 = 0;
        SVar9 = sh;
        if (1 < uVar14) {
          iVar13 = 0;
          do {
            uVar2 = puVar3[uVar14 - 1];
            uVar4 = SVar9 / uVar2;
            SVar9 = SVar9 % (ulong)uVar2;
            uVar14 = uVar14 - 1;
            iVar13 = iVar13 + ((uint)uVar4 & 1);
          } while (1 < uVar14);
        }
        iVar13 = ((uint)SVar9 & 1) + iVar13;
        if (iVar13 == 0) {
          if (iStack_60._M_current == local_58) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,iStack_60,
                       &local_70);
          }
          else {
            *iStack_60._M_current = local_70;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
        else if (iVar13 == 1) {
          update_cohomology_groups_edge(this,sh);
        }
        else {
          update_cohomology_groups(this,sh,iVar13);
        }
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar10);
    }
    iVar5._M_current = iStack_60._M_current;
    if (local_68 != iStack_60._M_current) {
      pSVar11 = local_68;
      do {
        local_48 = *pSVar11;
        if ((this->ds_parent_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[local_48] == local_48) {
          iVar7 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->zero_cocycles_)._M_h,&local_48);
          if (iVar7.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
              _M_cur == (__node_type *)0x0) {
            local_78 = cubical_complex::
                       Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                       ::simplex(this->cpx_,local_48);
            local_80 = 0xffffffffffffffff;
            local_4c = (this->coeff_field_).Prime;
            std::
            vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
            ::emplace_back<unsigned_long,unsigned_long,int>
                      ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                        *)&this->persistent_pairs_,&local_78,&local_80,&local_4c);
          }
        }
        pSVar11 = pSVar11 + 1;
      } while (pSVar11 != iVar5._M_current);
    }
    p_Var12 = (this->zero_cocycles_)._M_h._M_before_begin._M_nxt;
    if (p_Var12 != (_Hash_node_base *)0x0) {
      do {
        local_48 = cubical_complex::
                   Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                   ::simplex(this->cpx_,(Simplex_key)p_Var12[2]._M_nxt);
        local_78 = 0xffffffffffffffff;
        local_80 = CONCAT44(local_80._4_4_,(this->coeff_field_).Prime);
        std::
        vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
        ::emplace_back<unsigned_long,unsigned_long,int>
                  ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                    *)&this->persistent_pairs_,&local_48,&local_78,(int *)&local_80);
        p_Var12 = p_Var12->_M_nxt;
      } while (p_Var12 != (_Hash_node_base *)0x0);
    }
    p_Var8 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        local_38 = p_Var8[1]._M_left;
        local_48 = *(Simplex_key *)(p_Var8 + 1);
        p_Stack_40 = p_Var8[1]._M_parent;
        local_78 = cubical_complex::
                   Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                   ::simplex(this->cpx_,local_48);
        local_80 = 0xffffffffffffffff;
        std::
        vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
        ::emplace_back<unsigned_long,unsigned_long,int&>
                  ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                    *)&this->persistent_pairs_,&local_78,&local_80,(int *)&local_38);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    if (local_68 != (Simplex_key *)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  return;
}

Assistant:

void compute_persistent_cohomology(Filtration_value min_interval_length = 0) {
    if (dim_max_ <= 0)
      return;  // --------->>

    interval_length_policy.set_length(min_interval_length);
    Simplex_key idx_fil = -1;
    std::vector<Simplex_key> vertices; // so we can check the connected components at the end
    // Compute all finite intervals
    for (auto sh : cpx_->filtration_simplex_range()) {
      cpx_->assign_key(sh, ++idx_fil);
      dsets_.make_set(cpx_->key(sh));
      int dim_simplex = cpx_->dimension(sh);
      switch (dim_simplex) {
        case 0:
          vertices.push_back(idx_fil);
          break;
        case 1:
          update_cohomology_groups_edge(sh);
          break;
        default:
          update_cohomology_groups(sh, dim_simplex);
          break;
      }
    }
    // Compute infinite intervals of dimension 0
    for (Simplex_key key : vertices) {  // for all 0-dimensional simplices
      if (ds_parent_[key] == key  // root of its tree
      && zero_cocycles_.find(key) == zero_cocycles_.end()) {
        persistent_pairs_.emplace_back(
            cpx_->simplex(key), cpx_->null_simplex(), coeff_field_.characteristic());
      }
    }
    for (auto zero_idx : zero_cocycles_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(zero_idx.second), cpx_->null_simplex(), coeff_field_.characteristic());
    }
    // Compute infinite interval of dimension > 0
    for (auto cocycle : transverse_idx_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(cocycle.first), cpx_->null_simplex(), cocycle.second.characteristics_);
    }
  }